

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

bool __thiscall
slang::IntervalMap<int,_int,_0U>::iterator::insertNode
          (iterator *this,uint32_t level,NodeRef node,interval<int> *key,allocator_type *alloc)

{
  Path *this_00;
  IntervalMap<int,_int,_0U> *this_01;
  uint32_t uVar1;
  IndexPair offset;
  pointer pEVar2;
  uint level_00;
  bool bVar4;
  ulong uVar3;
  
  this_00 = &(this->super_const_iterator).path;
  bVar4 = level == 1;
  if (bVar4) {
    this_01 = (this->super_const_iterator).map;
    uVar1 = ((this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)->
            offset;
    if (this_01->rootSize < 0xc) {
      IntervalMapDetails::BranchNode<int,_12U,_true>::insert
                ((BranchNode<int,_12U,_true> *)this_01,uVar1,this_01->rootSize,node,key);
      uVar1 = this_01->rootSize + 1;
      this_01->rootSize = uVar1;
      ((this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)->size =
           uVar1;
      uVar1 = 1;
      bVar4 = false;
      goto LAB_004297fa;
    }
    offset = splitRoot(this_01,uVar1,alloc);
    IntervalMapDetails::Path::replaceRoot<slang::IntervalMapDetails::BranchNode<int,12u,true>>
              (this_00,(BranchNode<int,_12U,_true> *)this_01,this_01->rootSize,offset);
    level = 2;
  }
  level_00 = level - 1;
  uVar3 = (ulong)level_00;
  IntervalMapDetails::Path::legalizeForInsert(this_00,level_00);
  pEVar2 = (this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  uVar1 = pEVar2[uVar3].size;
  if (uVar1 == 0xc) {
    bVar4 = IntervalMap<int,int,0u>::iterator::
            overflow<slang::IntervalMapDetails::BranchNode<int,12u,false>>
                      ((iterator *)this,level_00,alloc);
    if (bVar4) {
      uVar3 = (ulong)level;
    }
    pEVar2 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    uVar1 = pEVar2[uVar3].size;
  }
  IntervalMapDetails::BranchNode<int,_12U,_false>::insert
            ((BranchNode<int,_12U,_false> *)pEVar2[uVar3].node,pEVar2[uVar3].offset,uVar1,node,key);
  uVar1 = (uint32_t)uVar3;
  IntervalMapDetails::Path::setSize
            (this_00,uVar1,
             (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_[uVar3].size + 1);
  updateParentBounds(this,uVar1,key);
  uVar1 = uVar1 + 1;
LAB_004297fa:
  IntervalMapDetails::Path::reset(this_00,uVar1);
  return bVar4;
}

Assistant:

bool IntervalMap<TKey, TValue, N>::iterator::insertNode(
    uint32_t level, IntervalMapDetails::NodeRef node, const IntervalMapDetails::interval<TKey>& key,
    allocator_type& alloc) {
    SLANG_ASSERT(level > 0);

    bool split = false;
    auto& map = *this->map;
    auto& path = this->path;

    if (level == 1) {
        // Insert into the root branch node.
        if (map.rootSize < RootBranch::Capacity) {
            map.rootBranch.insert(path.offset(0), map.rootSize, node, key);
            path.setSize(0, ++map.rootSize);
            path.reset(level);
            return false;
        }

        // We need to split the root while keeping our position.
        split = true;
        auto newOffset = map.splitRoot(path.offset(0), alloc);
        path.replaceRoot(&map.rootBranch, map.rootSize, newOffset);

        // Fall through to insert at the new higher level.
        level++;
    }

    // When inserting before end, make sure we have a valid path.
    path.legalizeForInsert(--level);

    if (path.size(level) == Branch::Capacity) {
        // Branch node is full, we need to split it.
        SLANG_ASSERT(!split);
        split = overflow<Branch>(level, alloc);
        if (split)
            level++;
    }

    // Actually insert into the branch node.
    path.template node<Branch>(level).insert(path.offset(level), path.size(level), node, key);
    path.setSize(level, path.size(level) + 1);
    updateParentBounds(level, key);

    path.reset(level + 1);
    return split;
}